

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::BeginSection
          (BinaryReaderObjdump *this,Index section_index,BinarySection section_code,Offset size)

{
  ObjdumpMode OVar1;
  ObjdumpOptions *pOVar2;
  char *__s1;
  Offset OVar3;
  size_t offset;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  string_view sVar7;
  string match_name;
  long *local_50 [2];
  long local_40 [2];
  
  BinaryReaderObjdumpBase::BeginSection
            (&this->super_BinaryReaderObjdumpBase,section_index,section_code,size);
  pcVar6 = GetSectionName(section_code);
  sVar7 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->section_names,
                            section_index);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,sVar7._M_str,sVar7._M_str + sVar7._M_len);
  pOVar2 = (this->super_BinaryReaderObjdumpBase).options_;
  __s1 = pOVar2->section_name;
  if (__s1 != (char *)0x0) {
    iVar5 = strcasecmp(__s1,(char *)local_50[0]);
    if (iVar5 != 0) {
      bVar4 = false;
      goto LAB_00113b58;
    }
  }
  (this->super_BinaryReaderObjdumpBase).section_found_ = true;
  bVar4 = true;
LAB_00113b58:
  OVar1 = pOVar2->mode;
  if (OVar1 == RawData) {
    if (bVar4) {
      printf("\nContents of section %s:\n",pcVar6);
      offset = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                super_BinaryReaderDelegate.state)->offset;
      Stream::WriteMemoryDump
                (&((this->out_stream_)._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                 (this->super_BinaryReaderObjdumpBase).data_ + offset,size,offset,Yes,(char *)0x0,
                 (char *)0x0);
    }
  }
  else if (OVar1 == Details) {
    if (bVar4) {
      printf("%s",pcVar6);
      if (((uint)section_code < 0xd) && ((0x1101U >> (section_code & 0x1f) & 1) != 0)) {
        puts(":");
      }
      (this->super_BinaryReaderObjdumpBase).print_details_ = true;
    }
    else {
      (this->super_BinaryReaderObjdumpBase).print_details_ = false;
    }
  }
  else if (OVar1 == Headers) {
    OVar3 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
            state)->offset;
    printf("%9s start=%#010zx end=%#010zx (size=%#010zx) ",pcVar6,OVar3,OVar3 + size,size);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginSection(Index section_index,
                                         BinarySection section_code,
                                         Offset size) {
  BinaryReaderObjdumpBase::BeginSection(section_index, section_code, size);

  // |section_name| and |match_name| are identical for known sections. For
  // custom sections, |section_name| is "Custom", but |match_name| is the name
  // of the custom section.
  const char* section_name = wabt::GetSectionName(section_code);
  std::string match_name(GetSectionName(section_index));

  bool section_match = !options_->section_name ||
                       !strcasecmp(options_->section_name, match_name.c_str());
  if (section_match) {
    section_found_ = true;
  }

  switch (options_->mode) {
    case ObjdumpMode::Headers:
      printf("%9s start=%#010" PRIzx " end=%#010" PRIzx " (size=%#010" PRIoffset
             ") ",
             section_name, state->offset, state->offset + size, size);
      break;
    case ObjdumpMode::Details:
      if (section_match) {
        printf("%s", section_name);
        // All known section types except the Start and DataCount sections have
        // a count in which case this line gets completed in OnCount().
        if (section_code == BinarySection::Start ||
            section_code == BinarySection::DataCount ||
            section_code == BinarySection::Custom) {
          printf(":\n");
        }
        print_details_ = true;
      } else {
        print_details_ = false;
      }
      break;
    case ObjdumpMode::RawData:
      if (section_match) {
        printf("\nContents of section %s:\n", section_name);
        out_stream_->WriteMemoryDump(data_ + state->offset, size, state->offset,
                                     PrintChars::Yes);
      }
      break;
    case ObjdumpMode::Prepass:
    case ObjdumpMode::Disassemble:
      break;
  }
  return Result::Ok;
}